

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O3

bool __thiscall
FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryDiv<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>_>_>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<Fad<Fad<double>_>,_FadCst<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>_>_>_>
::hasFastAccess(FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryDiv<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>_>_>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<Fad<Fad<double>_>,_FadCst<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>_>_>_>
                *this)

{
  FadExpr<FadBinaryMul<FadExpr<FadBinaryDiv<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>_>_>,_Fad<Fad<double>_>_>_>
  *pFVar1;
  FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<Fad<double>_>_>_>,_Fad<Fad<double>_>_>_>
  *pFVar2;
  
  pFVar1 = (this->left_->fadexpr_).left_;
  if (((((((((((pFVar1->fadexpr_).left_)->fadexpr_).right_)->fadexpr_).right_)->dx_).num_elts != 0)
       && ((((pFVar1->fadexpr_).right_)->dx_).num_elts != 0)) &&
      ((((this->left_->fadexpr_).right_)->dx_).num_elts != 0)) &&
     (((((((this->right_->fadexpr_).left_)->fadexpr_).left_)->dx_).num_elts != 0 &&
      (pFVar2 = (this->right_->fadexpr_).right_,
      (((((pFVar2->fadexpr_).left_)->fadexpr_).right_)->dx_).num_elts != 0)))) {
    return (((pFVar2->fadexpr_).right_)->dx_).num_elts != 0;
  }
  return false;
}

Assistant:

bool hasFastAccess() const { return left_.hasFastAccess() && right_.hasFastAccess();}